

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

LBBox3fa * __thiscall embree::SceneGraph::Node::lbounds(Node *this,size_t i)

{
  LBBox3fa *in_RDI;
  float fVar1;
  
  fVar1 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->bounds0).lower.field_0 = CONCAT44(fVar1,fVar1);
  *(ulong *)((long)&(in_RDI->bounds0).lower.field_0 + 8) = CONCAT44(fVar1,fVar1);
  fVar1 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->bounds0).upper.field_0 = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  *(ulong *)((long)&(in_RDI->bounds0).upper.field_0 + 8) =
       CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  fVar1 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->bounds1).lower.field_0 = CONCAT44(fVar1,fVar1);
  *(ulong *)((long)&(in_RDI->bounds1).lower.field_0 + 8) = CONCAT44(fVar1,fVar1);
  fVar1 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->bounds1).upper.field_0 = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  *(ulong *)((long)&(in_RDI->bounds1).upper.field_0 + 8) =
       CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  return in_RDI;
}

Assistant:

virtual LBBox3fa lbounds(size_t i) const {
        return empty;
      }